

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

MAPPING_CHANNEL
Internal_BuiltInMappingChannelFromUnsigned
          (uint built_in_mapping_channel_as_unsigned,bool bEnableErrorMessage)

{
  MAPPING_CHANNEL MStack_c;
  bool bEnableErrorMessage_local;
  uint built_in_mapping_channel_as_unsigned_local;
  
  switch(built_in_mapping_channel_as_unsigned) {
  case 0:
    MStack_c = tc_channel;
    break;
  case 1:
    MStack_c = default_channel;
    break;
  case 0xfffffff1:
    MStack_c = screen_based_channel;
    break;
  case 0xfffffff2:
    MStack_c = wcs_channel;
    break;
  case 0xfffffff3:
    MStack_c = wcs_box_channel;
    break;
  case 0xfffffff4:
    MStack_c = environment_map_box_channel;
    break;
  case 0xfffffff5:
    MStack_c = environment_map_light_probe_channel;
    break;
  case 0xfffffff6:
    MStack_c = environment_map_spherical_channel;
    break;
  case 0xfffffff7:
    MStack_c = environment_map_cube_map_channel;
    break;
  case 0xfffffff8:
    MStack_c = environment_map_vcross_cube_map_channel;
    break;
  case 0xfffffff9:
    MStack_c = environment_map_hcross_cube_map_channel;
    break;
  case 0xfffffffa:
    MStack_c = environment_map_hemispherical_channel;
    break;
  default:
    if (bEnableErrorMessage) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_material.cpp"
                 ,0x8b8,"","Invalid built_in_mapping_channel_as_unsigned value.");
    }
    MStack_c = tc_channel;
    break;
  case 0xfffffffe:
    MStack_c = srfp_channel;
    break;
  case 0xffffffff:
    MStack_c = emap_channel;
  }
  return MStack_c;
}

Assistant:

static ON_Texture::MAPPING_CHANNEL Internal_BuiltInMappingChannelFromUnsigned(
  unsigned int built_in_mapping_channel_as_unsigned,
  bool bEnableErrorMessage
  )
{
  switch (built_in_mapping_channel_as_unsigned)
  {
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Texture::MAPPING_CHANNEL::tc_channel);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Texture::MAPPING_CHANNEL::default_channel);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Texture::MAPPING_CHANNEL::screen_based_channel);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Texture::MAPPING_CHANNEL::wcs_channel);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Texture::MAPPING_CHANNEL::wcs_box_channel);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Texture::MAPPING_CHANNEL::environment_map_box_channel);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Texture::MAPPING_CHANNEL::environment_map_light_probe_channel);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Texture::MAPPING_CHANNEL::environment_map_spherical_channel);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Texture::MAPPING_CHANNEL::environment_map_cube_map_channel);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Texture::MAPPING_CHANNEL::environment_map_vcross_cube_map_channel);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Texture::MAPPING_CHANNEL::environment_map_hcross_cube_map_channel);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Texture::MAPPING_CHANNEL::environment_map_hemispherical_channel);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Texture::MAPPING_CHANNEL::environment_map_emap_channel);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Texture::MAPPING_CHANNEL::srfp_channel);
  //ON_ENUM_FROM_UNSIGNED_CASE(ON_Texture::MAPPING_CHANNEL::emap_channel);
  }

  if (bEnableErrorMessage)
  {
    ON_ERROR("Invalid built_in_mapping_channel_as_unsigned value.");
  }
  return ON_Texture::MAPPING_CHANNEL::tc_channel;
}